

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::Value::removeIndex(Value *this,ArrayIndex index,Value *removed)

{
  bool bVar1;
  ushort uVar2;
  ValueHolder VVar3;
  CommentInfo *pCVar4;
  ValueHolder VVar5;
  ptrdiff_t pVar6;
  ptrdiff_t pVar7;
  ValueHolder VVar8;
  ValueHolder VVar9;
  undefined4 uVar10;
  ArrayIndex AVar11;
  iterator iVar12;
  Value *other;
  ValueHolder *pVVar13;
  uint aindex;
  bool bVar14;
  CZString keyLast;
  CZString key;
  CZString local_a0;
  ValueHolder local_90;
  ushort local_88;
  ValueHolder local_80;
  ValueHolder local_78;
  ValueHolder VStack_70;
  CZString local_68;
  ValueHolder local_58;
  ushort local_50;
  CommentInfo *local_48;
  ptrdiff_t local_40;
  ptrdiff_t pStack_38;
  
  if (this->field_0x8 == '\x06') {
    CZString::CZString(&local_68,index);
    iVar12 = std::
             _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
             ::find(&((this->value_).map_)->_M_t,&local_68);
    bVar14 = (_Rb_tree_header *)iVar12._M_node !=
             &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header;
    if (bVar14) {
      Value((Value *)&local_58,(Value *)&iVar12._M_node[1]._M_left);
      uVar2 = *(ushort *)&removed->field_0x8;
      VVar3 = removed->value_;
      removed->value_ = local_58;
      *(ushort *)&removed->field_0x8 = local_50 & 0x1ff | uVar2 & 0xfe00;
      local_50 = uVar2 & 0x1ff | local_50 & 0xfe00;
      pCVar4 = removed->comments_;
      removed->comments_ = local_48;
      pVar6 = removed->start_;
      pVar7 = removed->limit_;
      removed->start_ = local_40;
      removed->limit_ = pStack_38;
      local_58 = VVar3;
      local_48 = pCVar4;
      local_40 = pVar6;
      pStack_38 = pVar7;
      ~Value((Value *)&local_58);
      AVar11 = size(this);
      aindex = AVar11 - 1;
      if (index < aindex) {
        do {
          CZString::CZString(&local_a0,index);
          index = index + 1;
          other = operator[](this,index);
          Value((Value *)&local_90,other);
          pVVar13 = &std::
                     map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                     ::operator[]((this->value_).map_,&local_a0)->value_;
          uVar10 = _local_88;
          bVar1 = pVVar13[1].bool_;
          pVVar13[1].bool_ = local_88._0_1_;
          _local_88 = CONCAT31(stack0xffffffffffffff79,bVar1);
          VVar3 = *pVVar13;
          *pVVar13 = local_90;
          uVar2 = *(ushort *)(pVVar13 + 1);
          *(ushort *)(pVVar13 + 1) = uVar2 & 0xfeff | local_88 & 0x100;
          _local_88 = CONCAT22(SUB42(uVar10,2),local_88 & 0xfeff | uVar2 & 0x100);
          VVar5 = pVVar13[2];
          pVVar13[2] = local_80;
          VVar8 = pVVar13[3];
          VVar9 = pVVar13[4];
          pVVar13[3] = local_78;
          pVVar13[4] = VStack_70;
          local_90 = VVar3;
          local_80 = VVar5;
          local_78 = VVar8;
          VStack_70 = VVar9;
          ~Value((Value *)&local_90);
          CZString::~CZString(&local_a0);
        } while (aindex != index);
      }
      CZString::CZString(&local_a0,aindex);
      iVar12 = std::
               _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
               ::find(&((this->value_).map_)->_M_t,&local_a0);
      std::
      _Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
      ::erase_abi_cxx11_((_Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                          *)(this->value_).map_,iVar12);
      CZString::~CZString(&local_a0);
    }
    CZString::~CZString(&local_68);
  }
  else {
    bVar14 = false;
  }
  return bVar14;
}

Assistant:

bool Value::removeIndex(ArrayIndex index, Value* removed) {
  if (type_ != arrayValue) {
    return false;
  }
  CZString key(index);
  ObjectValues::iterator it = value_.map_->find(key);
  if (it == value_.map_->end()) {
    return false;
  }
  *removed = it->second;
  ArrayIndex oldSize = size();
  // shift left all items left, into the place of the "removed"
  for (ArrayIndex i = index; i < (oldSize - 1); ++i){
    CZString keey(i);
    (*value_.map_)[keey] = (*this)[i + 1];
  }
  // erase the last one ("leftover")
  CZString keyLast(oldSize - 1);
  ObjectValues::iterator itLast = value_.map_->find(keyLast);
  value_.map_->erase(itLast);
  return true;
}